

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::DebugNodeInputTextState(ImGuiInputTextState *state)

{
  ImWchar *in_text;
  bool bVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  float fVar6;
  char buf [64];
  
  Text("ID: 0x%08X, ActiveID: 0x%08X",(ulong)state->ID,(ulong)GImGui->ActiveId);
  DebugLocateItemOnHover(state->ID);
  Text("CurLenW: %d, CurLenA: %d, Cursor: %d, Selection: %d..%d",(ulong)(uint)state->CurLenA,
       (ulong)(uint)state->CurLenW,(ulong)(uint)(state->Stb).cursor,
       (ulong)(uint)(state->Stb).select_start,(ulong)(uint)(state->Stb).select_end);
  Text("undo_point: %d, redo_point: %d, undo_char_point: %d, redo_char_point: %d",
       (ulong)(uint)(int)(state->Stb).undostate.undo_point,
       (ulong)(uint)(int)(state->Stb).undostate.redo_point,
       (ulong)(uint)(state->Stb).undostate.undo_char_point,
       (ulong)(uint)(state->Stb).undostate.redo_char_point);
  fVar6 = GetTextLineHeight();
  buf._0_8_ = (ulong)(uint)(fVar6 * 15.0) << 0x20;
  bVar1 = BeginChild("undopoints",(ImVec2 *)buf,true,0);
  if (bVar1) {
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    PushStyleVar(0xe,(ImVec2 *)buf);
    piVar2 = &(state->Stb).undostate.undo_rec[0].char_storage;
    for (uVar4 = 0; uVar4 != 99; uVar4 = uVar4 + 1) {
      uVar5 = 0x75;
      if ((long)uVar4 < (long)(state->Stb).undostate.undo_point) {
LAB_001f289c:
        buf[0x30] = '\0';
        buf[0x31] = '\0';
        buf[0x32] = '\0';
        buf[0x33] = '\0';
        buf[0x34] = '\0';
        buf[0x35] = '\0';
        buf[0x36] = '\0';
        buf[0x37] = '\0';
        buf[0x38] = '\0';
        buf[0x39] = '\0';
        buf[0x3a] = '\0';
        buf[0x3b] = '\0';
        buf[0x3c] = '\0';
        buf[0x3d] = '\0';
        buf[0x3e] = '\0';
        buf[0x3f] = '\0';
        buf[0x20] = '\0';
        buf[0x21] = '\0';
        buf[0x22] = '\0';
        buf[0x23] = '\0';
        buf[0x24] = '\0';
        buf[0x25] = '\0';
        buf[0x26] = '\0';
        buf[0x27] = '\0';
        buf[0x28] = '\0';
        buf[0x29] = '\0';
        buf[0x2a] = '\0';
        buf[0x2b] = '\0';
        buf[0x2c] = '\0';
        buf[0x2d] = '\0';
        buf[0x2e] = '\0';
        buf[0x2f] = '\0';
        buf[0x10] = '\0';
        buf[0x11] = '\0';
        buf[0x12] = '\0';
        buf[0x13] = '\0';
        buf[0x14] = '\0';
        buf[0x15] = '\0';
        buf[0x16] = '\0';
        buf[0x17] = '\0';
        buf[0x18] = '\0';
        buf[0x19] = '\0';
        buf[0x1a] = '\0';
        buf[0x1b] = '\0';
        buf[0x1c] = '\0';
        buf[0x1d] = '\0';
        buf[0x1e] = '\0';
        buf[0x1f] = '\0';
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = '\0';
        buf[3] = '\0';
        buf[4] = '\0';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
        buf[8] = '\0';
        buf[9] = '\0';
        buf[10] = '\0';
        buf[0xb] = '\0';
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
        uVar3 = 0xffffffff;
        if ((long)*piVar2 != -1) {
          in_text = (state->Stb).undostate.undo_char + *piVar2;
          ImTextStrToUtf8(buf,0x40,in_text,in_text + piVar2[-2]);
          uVar3 = (ulong)(uint)*piVar2;
        }
        Text("%c [%02d] where %03d, insert %03d, delete %03d, char_storage %03d \"%s\"",uVar5,
             uVar4 & 0xffffffff,(ulong)(uint)((StbUndoRecord *)(piVar2 + -3))->where,
             (ulong)(uint)piVar2[-2],(ulong)(uint)piVar2[-1],uVar3,(ImVec2 *)buf);
      }
      else {
        uVar5 = 0x72;
        if ((long)(state->Stb).undostate.redo_point <= (long)uVar4) goto LAB_001f289c;
        BeginDisabled(true);
        buf[0x30] = '\0';
        buf[0x31] = '\0';
        buf[0x32] = '\0';
        buf[0x33] = '\0';
        buf[0x34] = '\0';
        buf[0x35] = '\0';
        buf[0x36] = '\0';
        buf[0x37] = '\0';
        buf[0x38] = '\0';
        buf[0x39] = '\0';
        buf[0x3a] = '\0';
        buf[0x3b] = '\0';
        buf[0x3c] = '\0';
        buf[0x3d] = '\0';
        buf[0x3e] = '\0';
        buf[0x3f] = '\0';
        buf[0x20] = '\0';
        buf[0x21] = '\0';
        buf[0x22] = '\0';
        buf[0x23] = '\0';
        buf[0x24] = '\0';
        buf[0x25] = '\0';
        buf[0x26] = '\0';
        buf[0x27] = '\0';
        buf[0x28] = '\0';
        buf[0x29] = '\0';
        buf[0x2a] = '\0';
        buf[0x2b] = '\0';
        buf[0x2c] = '\0';
        buf[0x2d] = '\0';
        buf[0x2e] = '\0';
        buf[0x2f] = '\0';
        buf[0x10] = '\0';
        buf[0x11] = '\0';
        buf[0x12] = '\0';
        buf[0x13] = '\0';
        buf[0x14] = '\0';
        buf[0x15] = '\0';
        buf[0x16] = '\0';
        buf[0x17] = '\0';
        buf[0x18] = '\0';
        buf[0x19] = '\0';
        buf[0x1a] = '\0';
        buf[0x1b] = '\0';
        buf[0x1c] = '\0';
        buf[0x1d] = '\0';
        buf[0x1e] = '\0';
        buf[0x1f] = '\0';
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = '\0';
        buf[3] = '\0';
        buf[4] = '\0';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
        buf[8] = '\0';
        buf[9] = '\0';
        buf[10] = '\0';
        buf[0xb] = '\0';
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
        Text("%c [%02d] where %03d, insert %03d, delete %03d, char_storage %03d \"%s\"",0x20,
             uVar4 & 0xffffffff,(ulong)(uint)((StbUndoRecord *)(piVar2 + -3))->where,
             (ulong)(uint)piVar2[-2],(ulong)(uint)piVar2[-1],(ulong)(uint)*piVar2,(ImVec2 *)buf);
        EndDisabled();
      }
      piVar2 = piVar2 + 4;
    }
    PopStyleVar(1);
  }
  EndChild();
  return;
}

Assistant:

void ImGui::DebugNodeInputTextState(ImGuiInputTextState* state)
{
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    ImGuiContext& g = *GImGui;
    ImStb::STB_TexteditState* stb_state = &state->Stb;
    ImStb::StbUndoState* undo_state = &stb_state->undostate;
    Text("ID: 0x%08X, ActiveID: 0x%08X", state->ID, g.ActiveId);
    DebugLocateItemOnHover(state->ID);
    Text("CurLenW: %d, CurLenA: %d, Cursor: %d, Selection: %d..%d", state->CurLenA, state->CurLenW, stb_state->cursor, stb_state->select_start, stb_state->select_end);
    Text("undo_point: %d, redo_point: %d, undo_char_point: %d, redo_char_point: %d", undo_state->undo_point, undo_state->redo_point, undo_state->undo_char_point, undo_state->redo_char_point);
    if (BeginChild("undopoints", ImVec2(0.0f, GetTextLineHeight() * 15), true)) // Visualize undo state
    {
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0, 0));
        for (int n = 0; n < STB_TEXTEDIT_UNDOSTATECOUNT; n++)
        {
            ImStb::StbUndoRecord* undo_rec = &undo_state->undo_rec[n];
            const char undo_rec_type = (n < undo_state->undo_point) ? 'u' : (n >= undo_state->redo_point) ? 'r' : ' ';
            if (undo_rec_type == ' ')
                BeginDisabled();
            char buf[64] = "";
            if (undo_rec_type != ' ' && undo_rec->char_storage != -1)
                ImTextStrToUtf8(buf, IM_ARRAYSIZE(buf), undo_state->undo_char + undo_rec->char_storage, undo_state->undo_char + undo_rec->char_storage + undo_rec->insert_length);
            Text("%c [%02d] where %03d, insert %03d, delete %03d, char_storage %03d \"%s\"",
                undo_rec_type, n, undo_rec->where, undo_rec->insert_length, undo_rec->delete_length, undo_rec->char_storage, buf);
            if (undo_rec_type == ' ')
                EndDisabled();
        }
        PopStyleVar();
    }
    EndChild();
#else
    IM_UNUSED(state);
#endif
}